

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

int __thiscall FStateDefinitions::AddStates(FStateDefinitions *this,FState *state,char *framechars)

{
  uint *puVar1;
  uint uVar2;
  FState *pFVar3;
  VMFunction *pVVar4;
  undefined8 uVar5;
  FState *pFVar6;
  undefined6 uVar7;
  SWORD SVar8;
  WORD WVar9;
  BYTE BVar10;
  BYTE BVar11;
  byte bVar12;
  int iVar13;
  FState *pFVar14;
  uint uVar15;
  bool bVar16;
  long lVar17;
  
  lVar17 = 0;
  bVar16 = false;
  uVar15 = 0;
  do {
    bVar12 = framechars[lVar17];
    if (bVar12 == 0x23) {
      bVar12 = 2;
    }
    else if (bVar12 == 0x5e) {
      uVar15 = 0x1b;
      bVar12 = 0;
    }
    else {
      if (bVar12 == 0) {
        pFVar14 = (this->StateArray).Array + ((this->StateArray).Count - 1);
        this->laststate = pFVar14;
        this->laststatebeforelabel = pFVar14;
        iVar13 = -(int)lVar17;
        if (!bVar16) {
          iVar13 = (int)lVar17;
        }
        return iVar13;
      }
      uVar15 = (bVar12 & 0xffffffdf) - 0x41;
      bVar12 = 0;
    }
    if (0x1c < uVar15) {
      bVar16 = true;
    }
    if (0x1c < uVar15) {
      uVar15 = 0;
    }
    state->Frame = (BYTE)uVar15;
    state->field_0x22 = state->field_0x22 & 0xfd | bVar12;
    TArray<FState,_FState>::Grow(&this->StateArray,1);
    pFVar14 = (this->StateArray).Array;
    uVar2 = (this->StateArray).Count;
    uVar7 = *(undefined6 *)&state->field_0x22;
    pFVar14[uVar2].Light = state->Light;
    *(undefined6 *)&pFVar14[uVar2].field_0x22 = uVar7;
    pFVar3 = state->NextState;
    pVVar4 = state->ActionFunc;
    SVar8 = state->Tics;
    WVar9 = state->TicRange;
    BVar10 = state->Frame;
    BVar11 = state->DefineFlags;
    uVar5 = *(undefined8 *)&state->Misc1;
    pFVar6 = pFVar14 + uVar2;
    pFVar6->sprite = state->sprite;
    pFVar6->Tics = SVar8;
    pFVar6->TicRange = WVar9;
    pFVar6->Frame = BVar10;
    pFVar6->DefineFlags = BVar11;
    *(undefined8 *)(&pFVar6->sprite + 4) = uVar5;
    pFVar14[uVar2].NextState = pFVar3;
    pFVar14[uVar2].ActionFunc = pVVar4;
    puVar1 = &(this->StateArray).Count;
    *puVar1 = *puVar1 + 1;
    state->field_0x22 = state->field_0x22 & 0xf7;
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

int FStateDefinitions::AddStates(FState *state, const char *framechars)
{
	bool error = false;
	int frame = 0;
	int count = 0;
	while (*framechars)
	{
		bool noframe = false;

		if (*framechars == '#')
			noframe = true;
		else if (*framechars == '^') 
			frame = '\\' - 'A';
		else 
			frame = (*framechars & 223) - 'A';

		framechars++;
		if (frame < 0 || frame > 28)
		{
			frame = 0;
			error = true;
		}

		state->Frame = frame;
		state->SameFrame = noframe;
		StateArray.Push(*state);
		++count;

		// NODELAY flag is not carried past the first state
		state->NoDelay = false;
	}
	laststate = &StateArray[StateArray.Size() - 1];
	laststatebeforelabel = laststate;
	return !error ? count : -count;
}